

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_state.cc
# Opt level: O1

void __thiscall StateVar::GenAccessFunction(StateVar *this,Output *out_h,Env *env)

{
  _Alloc_hider _Var1;
  char *pcVar2;
  char *pcVar3;
  string local_48;
  
  Type::DataTypeConstRefStr_abi_cxx11_(&local_48,this->type_);
  _Var1._M_p = local_48._M_dataplus._M_p;
  pcVar2 = Env::RValue(env,this->id_);
  pcVar3 = Env::LValue(env,this->id_);
  Output::println(out_h,"%s %s const\t{ return %s; }",_Var1._M_p,pcVar2,pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StateVar::GenAccessFunction(Output* out_h, Env* env)
	{
	out_h->println("%s %s const	{ return %s; }", type_->DataTypeConstRefStr().c_str(),
	               env->RValue(id_), env->LValue(id_));
	}